

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simg2img.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  int __fd;
  int iVar2;
  long lVar3;
  __off_t _Var4;
  char *__format;
  char *pcVar5;
  ulong uVar6;
  ulong uVar7;
  size_t sStack_40;
  
  if (argc < 3) {
    usage();
  }
  else {
    uVar6 = (ulong)(argc - 1);
    iVar1 = open(argv[uVar6],0x241,0x1b4);
    if (iVar1 < 0) {
      pcVar5 = argv[uVar6];
      __format = "Cannot open output file %s\n";
LAB_00101239:
      fprintf(_stderr,__format,pcVar5);
    }
    else {
      uVar7 = 1;
      while( true ) {
        if (uVar6 == uVar7) {
          close(iVar1);
          exit(0);
        }
        pcVar5 = argv[uVar7];
        if ((*pcVar5 == '-') && (pcVar5[1] == '\0')) {
          __fd = 0;
        }
        else {
          __fd = open(pcVar5,0);
          if (__fd < 0) {
            pcVar5 = argv[uVar7];
            __format = "Cannot open input file %s\n";
            goto LAB_00101239;
          }
        }
        lVar3 = sparse_file_import(__fd,1,0);
        if (lVar3 == 0) break;
        _Var4 = lseek(iVar1,0,0);
        if (_Var4 == -1) {
          perror("lseek failed");
          iVar1 = 1;
          goto LAB_00101319;
        }
        iVar2 = sparse_file_write(lVar3,iVar1,0,0,0);
        if (iVar2 < 0) {
          pcVar5 = "Cannot write output file\n";
          sStack_40 = 0x19;
          goto LAB_0010130e;
        }
        sparse_file_destroy(lVar3);
        close(__fd);
        uVar7 = uVar7 + 1;
      }
      pcVar5 = "Failed to read sparse file\n";
      sStack_40 = 0x1b;
LAB_0010130e:
      fwrite(pcVar5,sStack_40,1,_stderr);
    }
  }
  iVar1 = -1;
LAB_00101319:
  exit(iVar1);
}

Assistant:

int main(int argc, char* argv[]) {
  int in;
  int out;
  int i;
  struct sparse_file* s;

  if (argc < 3) {
    usage();
    exit(-1);
  }

  out = open(argv[argc - 1], O_WRONLY | O_CREAT | O_TRUNC | O_BINARY, 0664);
  if (out < 0) {
    fprintf(stderr, "Cannot open output file %s\n", argv[argc - 1]);
    exit(-1);
  }

  for (i = 1; i < argc - 1; i++) {
    if (strcmp(argv[i], "-") == 0) {
      in = STDIN_FILENO;
    } else {
      in = open(argv[i], O_RDONLY | O_BINARY);
      if (in < 0) {
        fprintf(stderr, "Cannot open input file %s\n", argv[i]);
        exit(-1);
      }
    }

    s = sparse_file_import(in, true, false);
    if (!s) {
      fprintf(stderr, "Failed to read sparse file\n");
      exit(-1);
    }

    if (lseek(out, 0, SEEK_SET) == -1) {
      perror("lseek failed");
      exit(EXIT_FAILURE);
    }

    if (sparse_file_write(s, out, false, false, false) < 0) {
      fprintf(stderr, "Cannot write output file\n");
      exit(-1);
    }
    sparse_file_destroy(s);
    close(in);
  }

  close(out);

  exit(0);
}